

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

void helper_gvec_fcadds_arm(void *vd,void *vn,void *vm,void *vfpst,uint32_t desc)

{
  uint uVar1;
  uint32_t uVar2;
  float32 fVar3;
  float32 fVar4;
  ulong opr_sz_00;
  uintptr_t max_sz;
  float32 e3;
  float32 e2;
  float32 e1;
  float32 e0;
  uintptr_t i;
  uint32_t neg_imag;
  uint32_t neg_real;
  float_status *fpst;
  float32 *m;
  float32 *n;
  float32 *d;
  uintptr_t opr_sz;
  uint32_t desc_local;
  void *vfpst_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  opr_sz_00 = simd_oprsz(desc);
  uVar2 = extract32(desc,10,1);
  for (_e1 = 0; _e1 < opr_sz_00 >> 2; _e1 = _e1 + 2) {
    fVar4 = *(float32 *)((long)vn + _e1 * 4 + 4);
    uVar1 = *(uint *)((long)vm + _e1 * 4);
    fVar3 = float32_add_arm(*(float32 *)((long)vn + _e1 * 4),
                            *(uint *)((long)vm + _e1 * 4 + 4) ^ (uVar2 ^ 1) << 0x1f,
                            (float_status *)vfpst);
    *(float32 *)((long)vd + _e1 * 4) = fVar3;
    fVar4 = float32_add_arm(fVar4,uVar1 ^ uVar2 << 0x1f,(float_status *)vfpst);
    *(float32 *)((long)vd + _e1 * 4 + 4) = fVar4;
  }
  max_sz = simd_maxsz(desc);
  clear_tail(vd,opr_sz_00,max_sz);
  return;
}

Assistant:

void HELPER(gvec_fcadds)(void *vd, void *vn, void *vm,
                         void *vfpst, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    float32 *d = vd;
    float32 *n = vn;
    float32 *m = vm;
    float_status *fpst = vfpst;
    uint32_t neg_real = extract32(desc, SIMD_DATA_SHIFT, 1);
    uint32_t neg_imag = neg_real ^ 1;
    uintptr_t i;

    /* Shift boolean to the sign bit so we can xor to negate.  */
    neg_real <<= 31;
    neg_imag <<= 31;

    for (i = 0; i < opr_sz / 4; i += 2) {
        float32 e0 = n[H4(i)];
        float32 e1 = m[H4(i + 1)] ^ neg_imag;
        float32 e2 = n[H4(i + 1)];
        float32 e3 = m[H4(i)] ^ neg_real;

        d[H4(i)] = float32_add(e0, e1, fpst);
        d[H4(i + 1)] = float32_add(e2, e3, fpst);
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}